

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpload.c
# Opt level: O3

FT_ULong tt_face_get_location(TT_Face face,FT_UInt gindex,FT_UInt *asize)

{
  uint uVar1;
  ulong uVar2;
  FT_Byte *pFVar3;
  ushort uVar4;
  FT_ULong FVar5;
  ushort uVar6;
  FT_UInt FVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar2 = face->num_locations;
  if (gindex < uVar2) {
    pFVar3 = face->glyph_locations;
    if ((face->header).Index_To_Loc_Format == 0) {
      uVar6 = *(ushort *)(pFVar3 + gindex * 2);
      uVar4 = uVar6 << 8 | uVar6 >> 8;
      uVar6 = uVar4;
      if ((ushort *)((long)(pFVar3 + gindex * 2) + 4) <= pFVar3 + uVar2 * 2) {
        uVar6 = *(ushort *)(pFVar3 + (ulong)(gindex * 2) + 2) << 8 |
                *(ushort *)(pFVar3 + (ulong)(gindex * 2) + 2) >> 8;
      }
      FVar5 = (FT_ULong)((uint)uVar4 * 2);
      uVar9 = (ulong)((uint)uVar6 * 2);
    }
    else {
      uVar1 = *(uint *)(pFVar3 + (gindex << 2));
      FVar5 = (FT_ULong)
              (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
      uVar9 = FVar5;
      if ((uint *)((long)(pFVar3 + (gindex << 2)) + 8) <= pFVar3 + uVar2 * 4) {
        uVar1 = *(uint *)(pFVar3 + (ulong)(gindex << 2) + 4);
        uVar9 = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                       uVar1 << 0x18);
      }
    }
    uVar8 = face->glyf_len;
    if ((uVar8 < FVar5) || ((uVar8 < uVar9 && (uVar9 = uVar8, uVar2 - 2 != (ulong)gindex)))) {
      FVar7 = 0;
      FVar5 = 0;
      goto LAB_0016f80b;
    }
    if (FVar5 <= uVar9) {
      uVar8 = uVar9;
    }
  }
  else {
    FVar5 = 0;
    uVar8 = 0;
  }
  FVar7 = (int)uVar8 - (int)FVar5;
LAB_0016f80b:
  *asize = FVar7;
  return FVar5;
}

Assistant:

FT_LOCAL_DEF( FT_ULong )
  tt_face_get_location( TT_Face   face,
                        FT_UInt   gindex,
                        FT_UInt  *asize )
  {
    FT_ULong  pos1, pos2;
    FT_Byte*  p;
    FT_Byte*  p_limit;


    pos1 = pos2 = 0;

    if ( gindex < face->num_locations )
    {
      if ( face->header.Index_To_Loc_Format != 0 )
      {
        p       = face->glyph_locations + gindex * 4;
        p_limit = face->glyph_locations + face->num_locations * 4;

        pos1 = FT_NEXT_ULONG( p );
        pos2 = pos1;

        if ( p + 4 <= p_limit )
          pos2 = FT_NEXT_ULONG( p );
      }
      else
      {
        p       = face->glyph_locations + gindex * 2;
        p_limit = face->glyph_locations + face->num_locations * 2;

        pos1 = FT_NEXT_USHORT( p );
        pos2 = pos1;

        if ( p + 2 <= p_limit )
          pos2 = FT_NEXT_USHORT( p );

        pos1 <<= 1;
        pos2 <<= 1;
      }
    }

    /* Check broken location data. */
    if ( pos1 > face->glyf_len )
    {
      FT_TRACE1(( "tt_face_get_location:"
                  " too large offset (0x%08lx) found for glyph index %ld,\n"
                  "                     "
                  " exceeding the end of `glyf' table (0x%08lx)\n",
                  pos1, gindex, face->glyf_len ));
      *asize = 0;
      return 0;
    }

    if ( pos2 > face->glyf_len )
    {
      /* We try to sanitize the last `loca' entry. */
      if ( gindex == face->num_locations - 2 )
      {
        FT_TRACE1(( "tt_face_get_location:"
                    " too large size (%ld bytes) found for glyph index %ld,\n"
                    "                     "
                    " truncating at the end of `glyf' table to %ld bytes\n",
                    pos2 - pos1, gindex, face->glyf_len - pos1 ));
        pos2 = face->glyf_len;
      }
      else
      {
        FT_TRACE1(( "tt_face_get_location:"
                    " too large offset (0x%08lx) found for glyph index %ld,\n"
                    "                     "
                    " exceeding the end of `glyf' table (0x%08lx)\n",
                    pos2, gindex + 1, face->glyf_len ));
        *asize = 0;
        return 0;
      }
    }

    /* The `loca' table must be ordered; it refers to the length of */
    /* an entry as the difference between the current and the next  */
    /* position.  However, there do exist (malformed) fonts which   */
    /* don't obey this rule, so we are only able to provide an      */
    /* upper bound for the size.                                    */
    /*                                                              */
    /* We get (intentionally) a wrong, non-zero result in case the  */
    /* `glyf' table is missing.                                     */
    if ( pos2 >= pos1 )
      *asize = (FT_UInt)( pos2 - pos1 );
    else
      *asize = (FT_UInt)( face->glyf_len - pos1 );

    return pos1;
  }